

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

int __thiscall
QDirSortItemComparator::compareStrings
          (QDirSortItemComparator *this,QString *a,QString *b,CaseSensitivity cs)

{
  undefined4 in_ECX;
  QString *in_RDX;
  QCollator *in_RSI;
  QString *in_RDI;
  CaseSensitivity in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  int local_4;
  
  if ((in_RDI->d).ptr == (char16_t *)0x0) {
    local_4 = QString::compare((QString *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),in_RDI,
                               in_stack_ffffffffffffffcc);
  }
  else {
    local_4 = QCollator::compare(in_RSI,in_RDX,(QString *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8)
                                );
  }
  return local_4;
}

Assistant:

int compareStrings(const QString &a, const QString &b, Qt::CaseSensitivity cs) const
    {
#ifndef QT_BOOTSTRAPPED
        if (collator)
            return collator->compare(a, b);
#endif
        return a.compare(b, cs);
    }